

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fct_clp__final(fct_clp_t *clp)

{
  fct_clp_t *clp_local;
  
  fct_nlist__final(&clp->clo_list,fctcl__del);
  fct_nlist__final(&clp->param_list,free);
  return;
}

Assistant:

static void
fct_clp__final(fct_clp_t *clp)
{
    fct_nlist__final(&(clp->clo_list), (fct_nlist_on_del_t)fctcl__del);
    fct_nlist__final(&(clp->param_list), (fct_nlist_on_del_t)free);
}